

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::init
          (SymmetricOuterEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  ShaderProgram *pSVar4;
  RenderContext *renderCtx;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *log;
  TestError *this_00;
  char *code;
  undefined1 in_R9B;
  char *local_3b0;
  char *local_3a8;
  TransformFeedbackMode local_380;
  allocator<char> local_379;
  string local_378;
  TransformFeedbackVarying local_358;
  string local_338;
  ShaderSource local_318;
  string local_2f0;
  ShaderSource local_2d0;
  string local_2a8;
  ShaderSource local_288;
  string local_260;
  ShaderSource local_240;
  ProgramSources local_218;
  SharedPtr<const_glu::ShaderProgram> local_148;
  allocator<char> local_131;
  string local_130 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string tessellationEvaluationTemplate;
  string local_68 [8];
  string tessellationControlTemplate;
  allocator<char> local_31;
  string local_30 [8];
  string vertexShaderTemplate;
  SymmetricOuterEdgeCase *this_local;
  
  vertexShaderTemplate.field_2._8_8_ = this;
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_68,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nin highp float in_tc_attr[];\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = in_tc_attr[0];\n\tgl_TessLevelInner[1] = in_tc_attr[1];\n\n\tgl_TessLevelOuter[0] = in_tc_attr[2];\n\tgl_TessLevelOuter[1] = in_tc_attr[3];\n\tgl_TessLevelOuter[2] = in_tc_attr[4];\n\tgl_TessLevelOuter[3] = in_tc_attr[5];\n}\n"
             ,(allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  code = (char *)(ulong)this->m_winding;
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,this->m_winding,
             this->m_usePointMode & WINDING_CW,(bool)in_R9B);
  std::operator+(&local_f0,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+(&local_d0,&local_f0,
                 "\nout highp vec4 in_f_color;\nout highp vec4 out_te_tessCoord_isMirrored;\n\nvoid main (void)\n{\n"
                );
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    local_3a8 = 
    "\tfloat x = gl_TessCoord.x;\n\tfloat y = gl_TessCoord.y;\n\tfloat z = gl_TessCoord.z;\n\t// Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n\tout_te_tessCoord_isMirrored = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n\t                            : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n\t                            : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n\t                            : vec4(x, y, z, 0.0);\n"
    ;
  }
  else {
    if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
      local_3b0 = 
      "\tfloat x = gl_TessCoord.x;\n\tfloat y = gl_TessCoord.y;\n\t// Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n\tout_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n\t                            : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n\t                            : vec4(x, y, 0.0, 0.0);\n"
      ;
    }
    else {
      local_3b0 = (char *)0x0;
      code = 
      "\tfloat x = gl_TessCoord.x;\n\tfloat y = gl_TessCoord.y;\n\t// Mirror one half of each outer edge onto the other half\n\tout_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n\t                            : vec4(x, y, 0.0, 0.0f);\n"
      ;
      if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        local_3b0 = 
        "\tfloat x = gl_TessCoord.x;\n\tfloat y = gl_TessCoord.y;\n\t// Mirror one half of each outer edge onto the other half\n\tout_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n\t                            : vec4(x, y, 0.0, 0.0f);\n"
        ;
      }
    }
    local_3a8 = local_3b0;
  }
  std::operator+(&local_b0,&local_d0,local_3a8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,
                 "\n\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n\tin_f_color = vec4(1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_131);
  std::allocator<char>::~allocator(&local_131);
  pSVar4 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_218);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_260,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::VertexSource::VertexSource((VertexSource *)&local_240,&local_260);
  pPVar6 = glu::ProgramSources::operator<<(&local_218,&local_240);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_288,&local_2a8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_288);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f0,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2d0,&local_2f0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_2d0);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_338,(_anonymous_namespace_ *)pCVar1,pCVar5,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_318,&local_338);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"out_te_tessCoord_isMirrored",&local_379);
  glu::TransformFeedbackVarying::TransformFeedbackVarying(&local_358,&local_378);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_358);
  glu::TransformFeedbackMode::TransformFeedbackMode(&local_380,0x8c8c);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_380);
  glu::ShaderProgram::ShaderProgram(pSVar4,renderCtx,pPVar6);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_148,pSVar4);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_148);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_148);
  glu::TransformFeedbackVarying::~TransformFeedbackVarying(&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  glu::ProgramSources::~ProgramSources(&local_218);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar4);
  pSVar4 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar4);
  if (bVar2) {
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_68);
    iVar3 = std::__cxx11::string::~string(local_30);
    return iVar3;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x10c6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SymmetricOuterEdgeCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp float in_v_attr;\n"
												 "out highp float in_tc_attr;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 1) out;\n"
												 "\n"
												 "in highp float in_tc_attr[];\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
												 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
												 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
												 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
												 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, m_winding, m_usePointMode) +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "out highp vec4 out_te_tessCoord_isMirrored;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
													"	float x = gl_TessCoord.x;\n"
													"	float y = gl_TessCoord.y;\n"
													"	float z = gl_TessCoord.z;\n"
													"	// Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
													"	out_te_tessCoord_isMirrored = z == 0.0 && x > 0.5 && x != 1.0 ? vec4(1.0-x,  1.0-y,    0.0, 1.0)\n"
													"	                            : y == 0.0 && z > 0.5 && z != 1.0 ? vec4(1.0-x,    0.0,  1.0-z, 1.0)\n"
													"	                            : x == 0.0 && y > 0.5 && y != 1.0 ? vec4(  0.0,  1.0-y,  1.0-z, 1.0)\n"
													"	                            : vec4(x, y, z, 0.0);\n"
												  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
													"	float x = gl_TessCoord.x;\n"
													"	float y = gl_TessCoord.y;\n"
													"	// Mirror one half of each outer edge onto the other half, except the endpoints (because they belong to two edges)\n"
													"	out_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 && y != 1.0 ? vec4(    x, 1.0-y, 0.0, 1.0)\n"
													"	                            : (y == 0.0 || y == 1.0) && x > 0.5 && x != 1.0 ? vec4(1.0-x,     y, 0.0, 1.0)\n"
													"	                            : vec4(x, y, 0.0, 0.0);\n"
												  : m_primitiveType == TESSPRIMITIVETYPE_ISOLINES ?
													"	float x = gl_TessCoord.x;\n"
													"	float y = gl_TessCoord.y;\n"
													"	// Mirror one half of each outer edge onto the other half\n"
													"	out_te_tessCoord_isMirrored = (x == 0.0 || x == 1.0) && y > 0.5 ? vec4(x, 1.0-y, 0.0, 1.0)\n"
													"	                            : vec4(x, y, 0.0, 0.0f);\n"
												  : DE_NULL) +
												 "\n"
												 "	gl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
		<< glu::TransformFeedbackVarying		("out_te_tessCoord_isMirrored")
		<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}